

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

BSDFSample * __thiscall
pbrt::ThinDielectricBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,ThinDielectricBxDF *this,Vector3f wo,Float uc,
          Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [64];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dd;
  float fVar10;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  
  local_38._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_48._8_8_ = in_XMM0_Qb;
  local_48._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_38._4_4_ = in_XMM1_Db;
  local_38._8_4_ = 0;
  local_38._12_4_ = in_XMM1_Dd;
  auVar9._0_4_ = FrDielectric((Float)local_38._0_4_,this->eta);
  auVar9._4_60_ = extraout_var;
  auVar8 = auVar9._0_16_;
  fVar2 = 1.0 - auVar9._0_4_;
  if (auVar9._0_4_ < 1.0) {
    auVar8 = vfnmadd213ss_fma(auVar8,auVar8,SUB6416(ZEXT464(0x3f800000),0));
    fVar2 = auVar9._0_4_ + (auVar9._0_4_ * fVar2 * fVar2) / auVar8._0_4_;
    auVar8 = ZEXT416((uint)fVar2);
    fVar2 = 1.0 - fVar2;
  }
  fVar3 = (float)((uint)((byte)sampleFlags & 1) * (int)auVar8._0_4_);
  fVar4 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)fVar2);
  if (((fVar3 != 0.0) || (fVar4 != 0.0)) || (NAN(fVar4))) {
    fVar10 = fVar3 / (fVar4 + fVar3);
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(local_48,auVar6);
    if (fVar10 <= uc) {
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar8 = vxorps_avx512vl(local_38,auVar8);
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar7 = vandps_avx512vl(local_38,auVar7);
      SampledSpectrum::SampledSpectrum(&__return_storage_ptr__->f,fVar2 / auVar7._0_4_);
      uVar1 = vmovlps_avx(auVar6);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar1 >> 0x20);
      local_48._0_4_ = auVar8._0_4_;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = (float)local_48._0_4_;
      __return_storage_ptr__->pdf = fVar4 / (fVar4 + fVar3);
      __return_storage_ptr__->flags = SpecularTransmission;
    }
    else {
      auVar5._8_4_ = 0x7fffffff;
      auVar5._0_8_ = 0x7fffffff7fffffff;
      auVar5._12_4_ = 0x7fffffff;
      auVar7 = vandps_avx512vl(local_38,auVar5);
      SampledSpectrum::SampledSpectrum(&__return_storage_ptr__->f,auVar8._0_4_ / auVar7._0_4_);
      uVar1 = vmovlps_avx(auVar6);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar1 >> 0x20);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = (float)local_38._0_4_;
      __return_storage_ptr__->pdf = fVar10;
      __return_storage_ptr__->flags = SpecularReflection;
    }
  }
  else {
    __return_storage_ptr__->flags = Unset;
    (__return_storage_ptr__->f).values.values[0] = 0.0;
    (__return_storage_ptr__->f).values.values[1] = 0.0;
    (__return_storage_ptr__->f).values.values[2] = 0.0;
    (__return_storage_ptr__->f).values.values[3] = 0.0;
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags) const {
        Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
        // Compute _R_ and _T_ accounting for scattering between interfaces
        if (R < 1) {
            R += T * T * R / (1 - R * R);
            T = 1 - R;
        }

        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample perfect specular reflection at interface
            Vector3f wi(-wo.x, -wo.y, wo.z);
            SampledSpectrum fr(R / AbsCosTheta(wi));
            return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

        } else {
            // Sample perfect specular transmission at thin dielectric interface
            Vector3f wi = -wo;
            SampledSpectrum ft(T / AbsCosTheta(wi));
            return BSDFSample(ft, wi, pt / (pr + pt), BxDFFlags::SpecularTransmission);
        }
    }